

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

pair<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::Iterator,_bool>
* __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::insert
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this,
          int *key,int *payload)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  reference pvVar6;
  int *piVar7;
  type payload_00;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  used_fanout_tree_nodes_00;
  rep rVar8;
  model_node_type *pmVar9;
  int *in_RDX;
  data_node_type *in_RSI;
  pair<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::Iterator,_bool>
  *in_RDI;
  double dVar10;
  type duration;
  time_point end_time;
  bool should_split_downwards;
  int stop_propagation_level;
  bool reuse_model;
  FTNode *tree_node;
  int best_fanout;
  int fanout_tree_depth;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
  used_fanout_tree_nodes;
  int bucketID_2;
  time_point start_time;
  model_node_type *parent;
  vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
  traversal_path;
  int insert_pos;
  int fail;
  pair<int,_int> ret;
  data_node_type *leaf;
  double tolerance_1;
  int bucketID_prediction_rounded_1;
  data_node_type *leaf_2;
  int bucketID_1;
  double bucketID_prediction_1;
  model_node_type *node_1;
  AlexNode<int,_int> *cur_1;
  int in_stack_00000238;
  int in_stack_0000023c;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *in_stack_00000240;
  double tolerance;
  int bucketID_prediction_rounded;
  data_node_type *leaf_1;
  int bucketID;
  double bucketID_prediction;
  model_node_type *node;
  AlexNode<int,_int> *cur;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  pair<int,_int> in_stack_fffffffffffffd20;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  in_stack_fffffffffffffd28;
  type in_stack_fffffffffffffd30;
  bool local_2b9;
  undefined1 in_stack_fffffffffffffd67;
  int *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  uint in_stack_fffffffffffffd7c;
  uint in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd84;
  undefined1 left;
  pair<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::Iterator,_bool>
  *ppVar11;
  data_node_type *pdVar12;
  int in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  model_node_type *in_stack_fffffffffffffdb8;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
  *in_stack_fffffffffffffdc0;
  pair<int,_int> local_210;
  duration<long,_std::ratio<1L,_1000000000L>_> local_208;
  rep local_200;
  undefined8 local_1f8;
  bool local_1e9;
  int local_1e8;
  undefined1 local_1e1;
  reference local_1e0;
  undefined8 local_1d8;
  rep local_1d0;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> _Var13;
  uint uVar14;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
  *in_stack_fffffffffffffe48;
  int local_19c [3];
  undefined8 local_190;
  undefined8 in_stack_fffffffffffffe78;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
  *in_stack_fffffffffffffe80;
  undefined1 local_170 [31];
  undefined1 local_151;
  undefined1 in_stack_fffffffffffffeb5;
  undefined1 in_stack_fffffffffffffeb6;
  undefined1 in_stack_fffffffffffffeb7;
  double in_stack_fffffffffffffeb8;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
  *in_stack_fffffffffffffec0;
  int local_134;
  pair<int,_int> local_130;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *local_128;
  int *local_118;
  double local_100;
  int local_f4;
  AlexNode<int,_int> *local_f0;
  AlexNode<int,_int> *local_e8;
  int local_e0;
  int local_d4 [3];
  double local_c8;
  AlexNode<int,_int> *local_c0;
  AlexNode<int,_int> *local_b8;
  model_node_type *local_b0;
  undefined4 local_a8;
  undefined1 *local_a0;
  int local_94;
  AlexNode<int,_int> *local_88;
  double local_80;
  int local_74;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *local_70;
  int local_54 [4];
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
  *in_stack_ffffffffffffffc0;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *pAVar15;
  AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *in_stack_ffffffffffffffd0;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *local_8;
  
  ppVar11 = in_RDI;
  local_118 = in_RDX;
  if (in_RSI->min_key_ < *in_RDX) {
    in_RSI->num_right_out_of_bounds_inserts_ = in_RSI->num_right_out_of_bounds_inserts_ + 1;
    bVar2 = should_expand_right((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                                 *)in_RSI);
    if (bVar2) {
      expand_root(in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                  SUB81((ulong)in_stack_fffffffffffffe78 >> 0x18,0));
    }
  }
  else if (*in_RDX < ((InternalStats *)&in_RSI->max_key_)->key_domain_min_) {
    in_RSI->num_left_out_of_bounds_inserts_ = in_RSI->num_left_out_of_bounds_inserts_ + 1;
    bVar2 = should_expand_left((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                                *)in_RSI);
    if (bVar2) {
      expand_root(in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                  SUB81((ulong)in_stack_fffffffffffffe78 >> 0x18,0));
    }
  }
  iVar4 = *local_118;
  pAVar15 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
             *)(in_RSI->super_AlexNode<int,_int>)._vptr_AlexNode;
  pdVar12 = in_RSI;
  local_8 = pAVar15;
  if (((pAVar15->super_AlexNode<int,_int>).is_leaf_ & 1U) != 0) goto LAB_001756d5;
  do {
    in_stack_ffffffffffffffc0 = pAVar15;
    register0x00001200 =
         LinearModel<int>::predict_double
                   (&(in_stack_ffffffffffffffc0->super_AlexNode<int,_int>).model_,iVar4);
    local_54[2] = (int)register0x00001200;
    local_54[1] = 0;
    piVar7 = std::max<int>(local_54 + 2,local_54 + 1);
    local_54[0] = *(int *)&in_stack_ffffffffffffffc0->allocator_ + -1;
    piVar5 = std::min<int>(piVar7,local_54);
    iVar3 = (int)piVar7;
    local_54[2] = *piVar5;
    local_70 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                *)(&(in_stack_ffffffffffffffc0->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode
                  )[local_54[2]];
    pAVar15 = local_70;
  } while (((local_70->super_AlexNode<int,_int>).is_leaf_ & 1U) == 0);
  in_RSI->expansion_threshold_ =
       (double)((long)(local_70->super_AlexNode<int,_int>).level_ +
               (long)in_RSI->expansion_threshold_);
  local_74 = (int)(stack0xffffffffffffffb8 + 0.5);
  pAVar15 = local_70;
  dVar10 = std::numeric_limits<double>::epsilon();
  local_80 = dVar10 * 10.0 * stack0xffffffffffffffb8;
  dVar10 = stack0xffffffffffffffb8 - (double)local_74;
  std::abs(iVar3);
  if (dVar10 <= local_80) {
    if (stack0xffffffffffffffb8 < (double)local_74) {
      if ((local_70->next_leaf_ == (self_type *)0x0) ||
         (iVar3 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                  ::first_key((AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                               *)in_stack_fffffffffffffd28.__r), iVar4 < iVar3)) goto LAB_001756be;
      in_RSI = pdVar12;
      local_8 = local_70->next_leaf_;
    }
    else {
      if ((local_70->prev_leaf_ == (self_type *)0x0) ||
         (iVar3 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                  ::last_key((AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                              *)in_stack_fffffffffffffd28.__r), iVar3 < iVar4)) goto LAB_001756be;
      in_RSI = pdVar12;
      local_8 = local_70->prev_leaf_;
    }
  }
  else {
LAB_001756be:
    local_8 = local_70;
    in_RSI = pdVar12;
  }
LAB_001756d5:
  local_128 = local_8;
  local_130 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
              ::insert((AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                        *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                       (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                       in_stack_fffffffffffffd70);
  local_134 = local_130.first;
  if (local_130.first == -1) {
    Iterator::Iterator((Iterator *)in_stack_fffffffffffffd20,
                       (data_node_type *)
                       CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),0);
    local_151 = 0;
    std::
    pair<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::Iterator,_bool>
    ::
    pair<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::Iterator,_bool,_true>
              ((pair<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::Iterator,_bool>
                *)in_stack_fffffffffffffd30.__r,(Iterator *)in_stack_fffffffffffffd28.__r,
               (bool *)in_stack_fffffffffffffd20);
    return ppVar11;
  }
  pdVar12 = in_RSI;
  if (local_130.first == 0) goto LAB_00176293;
  std::
  vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
  ::vector((vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
            *)0x175791);
  local_94 = *local_118;
  local_a0 = local_170;
  pdVar12 = in_RSI;
  if (local_a0 != (undefined1 *)0x0) {
    local_b0 = *(model_node_type **)&(in_RSI->super_AlexNode<int,_int>).is_leaf_;
    local_a8 = 0;
    std::
    vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
    ::push_back((vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
                 *)in_stack_fffffffffffffd20,
                (value_type *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  }
  local_b8 = (AlexNode<int,_int> *)(in_RSI->super_AlexNode<int,_int>)._vptr_AlexNode;
  local_88 = local_b8;
  if ((local_b8->is_leaf_ & 1U) != 0) goto LAB_00175aff;
  do {
    local_c0 = local_b8;
    local_c8 = LinearModel<int>::predict_double(&local_b8->model_,local_94);
    local_d4[2] = (int)local_c8;
    local_d4[1] = 0;
    piVar7 = std::max<int>(local_d4 + 2,local_d4 + 1);
    local_d4[0] = *(int *)&local_c0[1].is_leaf_ + -1;
    piVar5 = std::min<int>(piVar7,local_d4);
    iVar4 = (int)piVar7;
    local_d4[2] = *piVar5;
    if (local_a0 != (undefined1 *)0x0) {
      iVar4 = (int)local_a0;
      local_e8 = local_c0;
      local_e0 = local_d4[2];
      std::
      vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
      ::push_back((vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
                   *)in_stack_fffffffffffffd20,
                  (value_type *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    }
    left = (undefined1)((ulong)in_RDI >> 0x38);
    local_f0 = *(AlexNode<int,_int> **)((long)local_c0[1].model_.a_ + (long)local_d4[2] * 8);
    local_b8 = local_f0;
  } while ((local_f0->is_leaf_ & 1U) == 0);
  in_RSI->expansion_threshold_ =
       (double)((long)local_f0->level_ + (long)in_RSI->expansion_threshold_);
  local_f4 = (int)(local_c8 + 0.5);
  dVar10 = std::numeric_limits<double>::epsilon();
  local_100 = dVar10 * 10.0 * local_c8;
  dVar10 = local_c8 - (double)local_f4;
  std::abs(iVar4);
  if (dVar10 <= local_100) {
    if (local_c8 < (double)local_f4) {
      if ((local_f0[1].model_.a_ == 0.0) ||
         (in_stack_fffffffffffffd84 =
               AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
               ::first_key((AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                            *)in_stack_fffffffffffffd28.__r), local_94 < in_stack_fffffffffffffd84))
      goto LAB_00175ae8;
      if (local_a0 != (undefined1 *)0x0) {
        correct_traversal_path
                  ((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *
                   )CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),pdVar12,
                   (vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
                    *)ppVar11,(bool)left);
      }
      local_88 = (AlexNode<int,_int> *)local_f0[1].model_.a_;
    }
    else {
      if ((local_f0[1].model_.b_ == 0.0) ||
         (iVar4 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                  ::last_key((AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                              *)in_stack_fffffffffffffd28.__r), iVar4 < local_94))
      goto LAB_00175ae8;
      if (local_a0 != (undefined1 *)0x0) {
        correct_traversal_path
                  ((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *
                   )CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),pdVar12,
                   (vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
                    *)ppVar11,(bool)left);
      }
      local_88 = (AlexNode<int,_int> *)local_f0[1].model_.b_;
    }
  }
  else {
LAB_00175ae8:
    local_88 = local_f0;
  }
LAB_00175aff:
  pvVar6 = std::
           vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
           ::back((vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
                   *)in_stack_fffffffffffffd20);
  pmVar9 = pvVar6->node;
  do {
    if (local_134 == 0) {
      bVar2 = false;
      break;
    }
    local_190 = std::chrono::_V2::system_clock::now();
    *(int *)((long)&pdVar12->allocator_ + 4) =
         local_128->num_resizes_ + *(int *)((long)&pdVar12->allocator_ + 4);
    if (pmVar9 == *(model_node_type **)&(pdVar12->super_AlexNode<int,_int>).is_leaf_) {
      update_superroot_key_domain
                ((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *)
                 in_stack_fffffffffffffd20);
    }
    local_19c[2] = LinearModel<int>::predict(&(pmVar9->super_AlexNode<int,_int>).model_,*local_118);
    local_19c[1] = 0;
    piVar7 = std::max<int>(local_19c + 2,local_19c + 1);
    local_19c[0] = pmVar9->num_children_ + -1;
    piVar7 = std::min<int>(piVar7,local_19c);
    local_19c[2] = *piVar7;
    std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::vector
              ((vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *)
               0x175c03);
    dVar10 = stack0xffffffffffffffb8;
    uVar14 = 1;
    unique0x10001258 = dVar10;
    if ((pdVar12->num_inserts_ != 0) && (local_134 < 2)) {
      uVar1 = (ulong)stack0xffffffffffffffb8 >> 0x20;
      iVar4 = (int)uVar1;
      iVar3 = (int)((ulong)pAVar15 >> 0x20);
      if (pdVar12->num_inserts_ == 1) {
        in_stack_fffffffffffffd80 =
             fanout_tree::find_best_fanout_existing_node<int,int>
                       (in_stack_ffffffffffffffd0,iVar3,(int)pAVar15,
                        (vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                         *)in_stack_ffffffffffffffc0,iVar4);
        uVar14 = in_stack_fffffffffffffd80;
      }
      else if (pdVar12->num_inserts_ == 2) {
        in_stack_fffffffffffffd7c =
             fanout_tree::find_best_fanout_existing_node<int,int>
                       (in_stack_ffffffffffffffd0,iVar3,(int)pAVar15,
                        (vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                         *)in_stack_ffffffffffffffc0,iVar4);
        uVar14 = in_stack_fffffffffffffd7c;
      }
    }
    iVar4 = 1 << (uVar14 & 0x1f);
    local_1d8 = std::chrono::_V2::system_clock::now();
    payload_00 = std::chrono::operator-
                           (in_stack_fffffffffffffd28.__r,
                            (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)in_stack_fffffffffffffd20);
    local_1d0 = payload_00.__r;
    used_fanout_tree_nodes_00 =
         std::chrono::
         duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                   ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                    CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    _Var13 = used_fanout_tree_nodes_00;
    rVar8 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)&stack0xfffffffffffffe38);
    pdVar12->num_exp_search_iterations_ =
         (longlong)((double)rVar8 + (double)pdVar12->num_exp_search_iterations_);
    if (uVar14 == 0) {
      in_stack_fffffffffffffd67 =
           AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
           is_append_mostly_right(local_128);
      AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
      is_append_mostly_left(local_128);
      AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::resize
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(bool)in_stack_fffffffffffffeb7
                 ,(bool)in_stack_fffffffffffffeb6,(bool)in_stack_fffffffffffffeb5);
      local_1e0 = std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                  ::operator[]((vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                                *)&stack0xfffffffffffffe48,0);
      (local_128->super_AlexNode<int,_int>).cost_ = local_1e0->cost;
      local_128->expected_avg_exp_search_iterations_ = local_1e0->expected_avg_search_iterations;
      local_128->expected_avg_shifts_ = local_1e0->expected_avg_shifts;
      AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
      reset_stats(local_128);
      *(int *)&pdVar12->next_leaf_ = *(int *)&pdVar12->next_leaf_ + 1;
    }
    else {
      local_1e1 = local_134 == 3;
      if ((*(bool *)&pdVar12->num_resizes_ & 1U) == 0) {
        local_2b9 = true;
        if ((pmVar9->num_children_ * iVar4) /
            (1 << ((local_128->super_AlexNode<int,_int>).duplication_factor_ & 0x1f)) <=
            ((DerivedParams *)&(pdVar12->super_AlexNode<int,_int>).cost_)->max_fanout) {
          local_2b9 = (pmVar9->super_AlexNode<int,_int>).level_ ==
                      ((*(model_node_type **)&(pdVar12->super_AlexNode<int,_int>).is_leaf_)->
                      super_AlexNode<int,_int>).level_;
        }
        local_1e9 = local_2b9;
        if (local_2b9 == false) {
          split_sideways((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                          *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                         (model_node_type *)
                         CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                         (int)((ulong)payload_00.__r >> 0x20),(int)payload_00.__r,
                         (vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                          *)used_fanout_tree_nodes_00.__r,(bool)in_stack_fffffffffffffd67);
        }
        else {
          pmVar9 = split_downwards(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                                   in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0,
                                   (vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                                    *)pdVar12,SUB81((ulong)ppVar11 >> 0x38,0));
        }
      }
      else {
        if (pdVar12->num_inserts_ == 2) {
          __assert_fail("experimental_params_.splitting_policy_method != 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                        ,0x4bc,
                        "std::pair<Iterator, bool> alex::Alex<int, int, alex::AlexCompare, std::allocator<std::pair<int, int>>, false>::insert(const T &, const P &) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = false]"
                       );
        }
        local_1e8 = best_split_propagation
                              (in_stack_fffffffffffffe48,
                               (vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
                                *)CONCAT44(uVar14,iVar4),SUB81((ulong)_Var13.__r >> 0x38,0));
        if (((*(model_node_type **)&(pdVar12->super_AlexNode<int,_int>).is_leaf_)->
            super_AlexNode<int,_int>).level_ < local_1e8) {
          in_stack_fffffffffffffd18 = 0;
          split_upwards(in_stack_00000240,in_stack_0000023c,in_stack_00000238,
                        (vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
                         *)cur_1,node_1._7_1_,(model_node_type **)bucketID_prediction_1,
                        bucketID_1._3_1_);
        }
        else {
          pmVar9 = split_downwards(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                                   in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0,
                                   (vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                                    *)pdVar12,SUB81((ulong)ppVar11 >> 0x38,0));
        }
      }
      local_128 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                   *)AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>::get_child_node
                               ((AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *)
                                in_stack_fffffffffffffd30.__r,(int *)in_stack_fffffffffffffd28.__r);
    }
    local_1f8 = std::chrono::_V2::system_clock::now();
    in_stack_fffffffffffffd30 =
         std::chrono::operator-
                   (in_stack_fffffffffffffd28.__r,
                    (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)in_stack_fffffffffffffd20);
    local_200 = in_stack_fffffffffffffd30.__r;
    in_stack_fffffffffffffd28 =
         std::chrono::
         duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                   ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                    CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    local_208.__r = in_stack_fffffffffffffd28.__r;
    rVar8 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_208);
    pdVar12->num_shifts_ = (longlong)((double)pdVar12->num_shifts_ + (double)rVar8);
    in_stack_fffffffffffffd20 =
         AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
         insert((AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                 *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                (int *)payload_00.__r);
    local_210 = in_stack_fffffffffffffd20;
    std::pair<int,_int>::operator=(&local_130,&local_210);
    local_134 = local_130.first;
    bVar2 = local_130.first == -1;
    if (bVar2) {
      Iterator::Iterator((Iterator *)in_stack_fffffffffffffd20,
                         (data_node_type *)
                         CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),0);
      std::
      pair<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::Iterator,_bool>
      ::
      pair<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::Iterator,_bool,_true>
                ((pair<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::Iterator,_bool>
                  *)in_stack_fffffffffffffd30.__r,(Iterator *)in_stack_fffffffffffffd28.__r,
                 (bool *)in_stack_fffffffffffffd20);
    }
    std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::~vector
              ((vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *)
               in_stack_fffffffffffffd30.__r);
  } while (!bVar2);
  std::
  vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
  ::~vector((vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::TraversalNode>_>
             *)in_stack_fffffffffffffd30.__r);
  if (bVar2) {
    return ppVar11;
  }
LAB_00176293:
  *(long *)&pdVar12->max_slots_ = *(long *)&pdVar12->max_slots_ + 1;
  ((Stats *)&pdVar12->key_less_)->num_keys = ((Stats *)&pdVar12->key_less_)->num_keys + 1;
  Iterator::Iterator((Iterator *)in_stack_fffffffffffffd20,
                     (data_node_type *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18)
                     ,0);
  std::
  pair<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::Iterator,_bool>
  ::
  pair<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::Iterator,_bool,_true>
            ((pair<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::Iterator,_bool>
              *)in_stack_fffffffffffffd30.__r,(Iterator *)in_stack_fffffffffffffd28.__r,
             (bool *)in_stack_fffffffffffffd20);
  return ppVar11;
}

Assistant:

std::pair<Iterator, bool> insert(const T& key, const P& payload) {
    // If enough keys fall outside the key domain, expand the root to expand the
    // key domain
    if (key > istats_.key_domain_max_) {
      istats_.num_keys_above_key_domain++;
      if (should_expand_right()) {
        expand_root(key, false);  // expand to the right
      }
    } else if (key < istats_.key_domain_min_) {
      istats_.num_keys_below_key_domain++;
      if (should_expand_left()) {
        expand_root(key, true);  // expand to the left
      }
    }

    data_node_type* leaf = get_leaf(key);

    // Nonzero fail flag means that the insert did not happen
    std::pair<int, int> ret = leaf->insert(key, payload);
    int fail = ret.first;
    int insert_pos = ret.second;
    if (fail == -1) {
      // Duplicate found and duplicates not allowed
      return {Iterator(leaf, insert_pos), false};
    }

    // If no insert, figure out what to do with the data node to decrease the
    // cost
    if (fail) {
      std::vector<TraversalNode> traversal_path;
      get_leaf(key, &traversal_path);
      model_node_type* parent = traversal_path.back().node;

      while (fail) {
        auto start_time = std::chrono::high_resolution_clock::now();
        stats_.num_expand_and_scales += leaf->num_resizes_;

        if (parent == superroot_) {
          update_superroot_key_domain();
        }
        int bucketID = parent->model_.predict(key);
        bucketID = std::min<int>(std::max<int>(bucketID, 0),
                                 parent->num_children_ - 1);
        std::vector<fanout_tree::FTNode> used_fanout_tree_nodes;

        int fanout_tree_depth = 1;
        if (experimental_params_.splitting_policy_method == 0 || fail >= 2) {
          // always split in 2. No extra work required here
        } else if (experimental_params_.splitting_policy_method == 1) {
          // decide between no split (i.e., expand and retrain) or splitting in
          // 2
          fanout_tree_depth = fanout_tree::find_best_fanout_existing_node<T, P>(
              parent, bucketID, stats_.num_keys, used_fanout_tree_nodes, 2);
        } else if (experimental_params_.splitting_policy_method == 2) {
          // use full fanout tree to decide fanout
          fanout_tree_depth = fanout_tree::find_best_fanout_existing_node<T, P>(
              parent, bucketID, stats_.num_keys, used_fanout_tree_nodes,
              derived_params_.max_fanout);
        }
        int best_fanout = 1 << fanout_tree_depth;
        stats_.cost_computation_time +=
            std::chrono::duration_cast<std::chrono::nanoseconds>(
                std::chrono::high_resolution_clock::now() - start_time)
                .count();

        if (fanout_tree_depth == 0) {
          // expand existing data node and retrain model
          leaf->resize(data_node_type::kMinDensity_, true,
                       leaf->is_append_mostly_right(),
                       leaf->is_append_mostly_left());
          fanout_tree::FTNode& tree_node = used_fanout_tree_nodes[0];
          leaf->cost_ = tree_node.cost;
          leaf->expected_avg_exp_search_iterations_ =
              tree_node.expected_avg_search_iterations;
          leaf->expected_avg_shifts_ = tree_node.expected_avg_shifts;
          leaf->reset_stats();
          stats_.num_expand_and_retrains++;
        } else {
          // split data node: always try to split sideways/upwards, only split
          // downwards if necessary
          bool reuse_model = (fail == 3);
          if (experimental_params_.allow_splitting_upwards) {
            // allow splitting upwards
            assert(experimental_params_.splitting_policy_method != 2);
            int stop_propagation_level = best_split_propagation(traversal_path);
            if (stop_propagation_level <= superroot_->level_) {
              parent = split_downwards(parent, bucketID, fanout_tree_depth,
                                       used_fanout_tree_nodes, reuse_model);
            } else {
              split_upwards(key, stop_propagation_level, traversal_path,
                            reuse_model, &parent);
            }
          } else {
            // either split sideways or downwards
            bool should_split_downwards =
                (parent->num_children_ * best_fanout /
                         (1 << leaf->duplication_factor_) >
                     derived_params_.max_fanout ||
                 parent->level_ == superroot_->level_);
            if (should_split_downwards) {
              parent = split_downwards(parent, bucketID, fanout_tree_depth,
                                       used_fanout_tree_nodes, reuse_model);
            } else {
              split_sideways(parent, bucketID, fanout_tree_depth,
                             used_fanout_tree_nodes, reuse_model);
            }
          }
          leaf = static_cast<data_node_type*>(parent->get_child_node(key));
        }
        auto end_time = std::chrono::high_resolution_clock::now();
        auto duration = end_time - start_time;
        stats_.splitting_time +=
            std::chrono::duration_cast<std::chrono::nanoseconds>(duration)
                .count();

        // Try again to insert the key
        ret = leaf->insert(key, payload);
        fail = ret.first;
        insert_pos = ret.second;
        if (fail == -1) {
          // Duplicate found and duplicates not allowed
          return {Iterator(leaf, insert_pos), false};
        }
      }
    }
    stats_.num_inserts++;
    stats_.num_keys++;
    return {Iterator(leaf, insert_pos), true};
  }